

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_data.cpp
# Opt level: O3

int32_t __thiscall
cornelich::vanilla_data::find_next_data_file_number
          (vanilla_data *this,int32_t cycle,int32_t thread_id)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *this_00;
  pointer pcVar4;
  int iVar5;
  _Alloc_hider _Var6;
  long lVar7;
  bool bVar8;
  int32_t index;
  directory_iterator __begin1;
  type context;
  directory_iterator __end1;
  directory_iterator end;
  directory_iterator begin;
  string data_prefix;
  path path;
  string_type name;
  error_code err;
  any_int_parser<int,10u,1u,_1> local_27d;
  int local_27c;
  directory_iterator local_278;
  string local_270;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_250;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_248;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_240;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_238;
  directory_iterator local_230;
  iterator_range<boost::filesystem::directory_iterator> local_228;
  path local_218;
  path local_1f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [7];
  ios_base local_148 [264];
  error_code local_40;
  
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1c8 + 0x10);
  pcVar4 = (this->m_settings->m_path)._M_dataplus._M_p;
  local_1c8._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar4,pcVar4 + (this->m_settings->m_path)._M_string_length);
  cycle_formatter::date_from_cycle_abi_cxx11_
            (&local_270,
             (this->m_settings->m_cycle_format).
             super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)cycle);
  paVar3 = &local_218.m_pathname.field_2;
  local_218.m_pathname._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,local_270._M_dataplus._M_p,
             local_270._M_dataplus._M_p + local_270._M_string_length);
  boost::filesystem::path::operator/=((path *)local_1c8,&local_218);
  local_1f8.m_pathname._M_dataplus._M_p = (pointer)&local_1f8.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ == paVar2) {
    local_1f8.m_pathname.field_2._8_8_ = local_1b8[0]._8_8_;
  }
  else {
    local_1f8.m_pathname._M_dataplus._M_p = (pointer)local_1c8._0_8_;
  }
  local_1f8.m_pathname._M_string_length = local_1c8._8_8_;
  local_1c8._8_8_ = 0;
  local_1b8[0]._M_local_buf[0] = '\0';
  local_1c8._0_8_ = paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_218.m_pathname._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != paVar2) {
    operator_delete((void *)local_1c8._0_8_);
  }
  boost::system::error_code::error_code(&local_40);
  boost::filesystem::directory_iterator::directory_iterator(&local_230,&local_1f8,&local_40);
  local_238.px = (dir_itr_imp *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1c8);
  this_00 = (ostream *)(local_1c8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (this_00,DATA_FILE_NAME_PREFIX_abi_cxx11_,DAT_0011f468);
  std::ostream::operator<<((ostream *)this_00,thread_id);
  local_270._M_dataplus._M_p._0_1_ = 0x2d;
  std::__ostream_insert<char,std::char_traits<char>>(this_00,(char *)&local_270,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1c8);
  std::ios_base::~ios_base(local_148);
  local_240 = local_230.m_imp.px;
  if (local_230.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_230.m_imp.px = *(int *)local_230.m_imp.px + 1;
    UNLOCK();
  }
  local_248.px = local_238.px;
  if (local_238.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_238.px = *(int *)local_238.px + 1;
    UNLOCK();
  }
  local_1c8._0_8_ = local_230.m_imp.px;
  if (local_230.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_230.m_imp.px = *(int *)local_230.m_imp.px + 1;
    UNLOCK();
  }
  local_270._M_dataplus._M_p = (pointer)local_238.px;
  if (local_238.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_238.px = *(int *)local_238.px + 1;
    UNLOCK();
  }
  boost::iterator_range<boost::filesystem::directory_iterator>::
  iterator_range<boost::filesystem::directory_iterator>
            (&local_228,(directory_iterator *)local_1c8,(directory_iterator *)&local_270);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_270);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)local_1c8);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_248);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_240);
  local_278.m_imp.px =
       local_228.
       super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
       .m_Begin.m_imp.px;
  if (local_228.
      super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_228.
            super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.m_imp.px =
         *(int *)local_228.
                 super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin.m_imp.px + 1;
    UNLOCK();
  }
  local_250 = local_228.
              super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
              .m_End.m_imp.px;
  if (local_228.
      super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
      .m_End.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_228.
            super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
            .m_End.m_imp.px =
         *(int *)local_228.
                 super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
                 .m_End.m_imp.px + 1;
    UNLOCK();
  }
  iVar5 = -1;
  while (local_278.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_250.px)
  {
    if ((local_278.m_imp.px == (dir_itr_imp *)0x0) ||
       (*(long *)((long)local_278.m_imp.px + 0x38) == 0)) {
      if ((local_250.px == (dir_itr_imp *)0x0) || (*(long *)(local_250.px + 0x38) == 0)) break;
      if ((local_278.m_imp.px == (dir_itr_imp *)0x0) ||
         (*(long *)((long)local_278.m_imp.px + 0x38) == 0)) {
        __assert_fail("(!is_end())&&(\"attempt to dereference end directory iterator\")",
                      "/usr/include/boost/filesystem/directory.hpp",0x140,
                      "boost::iterator_facade<directory_iterator, directory_entry, boost::single_pass_traversal_tag>::reference boost::filesystem::directory_iterator::dereference() const"
                     );
      }
    }
    boost::filesystem::path::filename();
    local_1c8._0_8_ = this_00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_270._M_dataplus._M_p,
               local_270._M_dataplus._M_p + local_270._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    _Var6._M_p = local_218.m_pathname._M_dataplus._M_p;
    if (local_218.m_pathname._M_string_length != 0 && local_1c8._8_8_ != 0) {
      lVar7 = 0;
      do {
        if (*(ostream *)(local_1c8._0_8_ + lVar7) !=
            *(ostream *)(local_218.m_pathname._M_dataplus._M_p + lVar7)) goto LAB_00114762;
        lVar1 = lVar7 + 1;
      } while ((local_1c8._8_8_ - 1 != lVar7) &&
              (bVar8 = local_218.m_pathname._M_string_length - 1 != lVar7, lVar7 = lVar1, bVar8));
      _Var6._M_p = local_218.m_pathname._M_dataplus._M_p + lVar1;
    }
    if (_Var6._M_p == local_218.m_pathname._M_dataplus._M_p + local_218.m_pathname._M_string_length)
    {
      local_1d0._M_current = (char *)(local_1c8._0_8_ + local_1c8._8_8_);
      local_27c = -1;
      local_1d8._M_current =
           (char *)(local_1c8._0_8_ + (long)(int)local_218.m_pathname._M_string_length);
      local_270._M_dataplus._M_p = (pointer)&local_27c;
      boost::spirit::qi::any_int_parser<int,10u,1u,-1>::
      parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<int&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::unused_type,int>
                (&local_27d,&local_1d8,&local_1d0,
                 (context<boost::fusion::cons<int_&,_boost::fusion::nil_>,_boost::spirit::locals<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
                  *)&local_270,(unused_type *)&boost::spirit::unused,&local_27c);
      if (iVar5 <= local_27c) {
        iVar5 = local_27c;
      }
    }
LAB_00114762:
    if ((ostream *)local_1c8._0_8_ != this_00) {
      operator_delete((void *)local_1c8._0_8_);
    }
    boost::filesystem::detail::directory_iterator_increment(&local_278,(error_code *)0x0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_250);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_278.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            (&local_228.
              super_iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
              .m_End.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_pathname._M_dataplus._M_p != &local_218.m_pathname.field_2) {
    operator_delete(local_218.m_pathname._M_dataplus._M_p);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_238);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_230.m_imp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_pathname._M_dataplus._M_p != &local_1f8.m_pathname.field_2) {
    operator_delete(local_1f8.m_pathname._M_dataplus._M_p);
  }
  return iVar5 + 1;
}

Assistant:

std::int32_t vanilla_data::find_next_data_file_number(std::int32_t cycle, std::int32_t thread_id) const
{
    std::int32_t last_number = -1;
    const auto path = fs::path(m_settings.path()) / m_settings.cycle_format().date_from_cycle(cycle);

    boost::system::error_code err;
    fs::directory_iterator begin(path, err);
    fs::directory_iterator end;

    const auto data_prefix = (util::streamer() << DATA_FILE_NAME_PREFIX << thread_id << '-').str();

    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        auto name = entry.path().filename().native();
        if(boost::algorithm::starts_with(name, data_prefix))
        {
            std::int32_t index = -1;
            util::parse_number(name.begin() + (std::int32_t)data_prefix.size(), name.end(), index);
            if(last_number < index)
                last_number = index;
        }
    }
    // Move to the next data file
    return last_number + 1;

}